

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

wchar_t init_WinZip_AES_decryption(archive_read *a)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  wchar_t wVar4;
  uint8_t *salt;
  char *pcVar5;
  size_t pw_len;
  ulong uVar6;
  long lVar7;
  uint8_t *key;
  ulong salt_len;
  int iVar8;
  size_t sStackY_c0;
  uint8_t derived_key [66];
  
  pvVar1 = a->format->data;
  if (*(char *)((long)pvVar1 + 0x1e0) != '\0') {
    return L'\0';
  }
  if (*(char *)((long)pvVar1 + 0x1f0) != '\0') {
    return L'\0';
  }
  iVar8 = *(int *)(*(long *)((long)pvVar1 + 0x68) + 0x88);
  if (iVar8 == 1) {
    key = derived_key + 0x10;
    salt_len = 8;
    sStackY_c0 = 0x10;
  }
  else if (iVar8 == 3) {
    key = derived_key + 0x20;
    salt_len = 0x10;
    sStackY_c0 = 0x20;
  }
  else {
    if (iVar8 != 2) {
LAB_0035b748:
      pcVar5 = "Corrupted ZIP file data";
      goto LAB_0035b74f;
    }
    key = derived_key + 0x18;
    salt_len = 0xc;
    sStackY_c0 = 0x18;
  }
  iVar8 = 0;
  salt = (uint8_t *)__archive_read_ahead(a,salt_len | 2,(ssize_t *)0x0);
  if (salt != (uint8_t *)0x0) {
    uVar6 = (ulong)(uint)((int)sStackY_c0 * 2);
    do {
      pcVar5 = __archive_read_next_passphrase(a);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = "Incorrect passphrase";
        if (iVar8 == 0) {
          pcVar5 = "Passphrase required for this entry";
        }
LAB_0035b6d6:
        archive_set_error(&a->archive,-1,pcVar5);
        return L'\xffffffe7';
      }
      derived_key[0x30] = '\0';
      derived_key[0x31] = '\0';
      derived_key[0x32] = '\0';
      derived_key[0x33] = '\0';
      derived_key[0x34] = '\0';
      derived_key[0x35] = '\0';
      derived_key[0x36] = '\0';
      derived_key[0x37] = '\0';
      derived_key[0x38] = '\0';
      derived_key[0x39] = '\0';
      derived_key[0x3a] = '\0';
      derived_key[0x3b] = '\0';
      derived_key[0x3c] = '\0';
      derived_key[0x3d] = '\0';
      derived_key[0x3e] = '\0';
      derived_key[0x3f] = '\0';
      derived_key[0x20] = '\0';
      derived_key[0x21] = '\0';
      derived_key[0x22] = '\0';
      derived_key[0x23] = '\0';
      derived_key[0x24] = '\0';
      derived_key[0x25] = '\0';
      derived_key[0x26] = '\0';
      derived_key[0x27] = '\0';
      derived_key[0x28] = '\0';
      derived_key[0x29] = '\0';
      derived_key[0x2a] = '\0';
      derived_key[0x2b] = '\0';
      derived_key[0x2c] = '\0';
      derived_key[0x2d] = '\0';
      derived_key[0x2e] = '\0';
      derived_key[0x2f] = '\0';
      derived_key[0x10] = '\0';
      derived_key[0x11] = '\0';
      derived_key[0x12] = '\0';
      derived_key[0x13] = '\0';
      derived_key[0x14] = '\0';
      derived_key[0x15] = '\0';
      derived_key[0x16] = '\0';
      derived_key[0x17] = '\0';
      derived_key[0x18] = '\0';
      derived_key[0x19] = '\0';
      derived_key[0x1a] = '\0';
      derived_key[0x1b] = '\0';
      derived_key[0x1c] = '\0';
      derived_key[0x1d] = '\0';
      derived_key[0x1e] = '\0';
      derived_key[0x1f] = '\0';
      derived_key[0] = '\0';
      derived_key[1] = '\0';
      derived_key[2] = '\0';
      derived_key[3] = '\0';
      derived_key[4] = '\0';
      derived_key[5] = '\0';
      derived_key[6] = '\0';
      derived_key[7] = '\0';
      derived_key[8] = '\0';
      derived_key[9] = '\0';
      derived_key[10] = '\0';
      derived_key[0xb] = '\0';
      derived_key[0xc] = '\0';
      derived_key[0xd] = '\0';
      derived_key[0xe] = '\0';
      derived_key[0xf] = '\0';
      derived_key[0x40] = '\0';
      derived_key[0x41] = '\0';
      pw_len = strlen(pcVar5);
      iVar3 = pbkdf2_sha1(pcVar5,pw_len,salt,salt_len,1000,derived_key,uVar6 | 2);
      if (iVar3 != 0) {
LAB_0035b6cf:
        pcVar5 = "Decryption is unsupported due to lack of crypto library";
        goto LAB_0035b6d6;
      }
      if ((derived_key[uVar6] == salt[salt_len]) && (derived_key[uVar6 + 1] == salt[salt_len + 1]))
      {
        iVar8 = aes_ctr_init((archive_crypto_ctx *)((long)pvVar1 + 0x188),derived_key,sStackY_c0);
        if (iVar8 != 0) goto LAB_0035b6cf;
        iVar8 = __hmac_sha1_init((archive_hmac_sha1_ctx *)((long)pvVar1 + 0x1e8),key,sStackY_c0);
        if (iVar8 != 0) {
          aes_ctr_release((archive_crypto_ctx *)((long)pvVar1 + 0x188));
          pcVar5 = "Failed to initialize HMAC-SHA1";
          goto LAB_0035b6d6;
        }
        *(undefined1 *)((long)pvVar1 + 0x1f0) = 1;
        *(undefined1 *)((long)pvVar1 + 0x1e0) = 1;
        __archive_read_consume(a,salt_len | 2);
        lVar2 = *(long *)((long)pvVar1 + 0x68);
        lVar7 = *(long *)((long)pvVar1 + 0x70) - (salt_len + 0xc);
        *(long *)((long)pvVar1 + 0x70) = lVar7;
        if (((*(byte *)(lVar2 + 0x7e) & 8) != 0) || (-1 < lVar7)) {
          *(long *)((long)pvVar1 + 0x78) = *(long *)((long)pvVar1 + 0x78) + salt_len + 0xc;
          *(undefined8 *)((long)pvVar1 + 0x168) = 0;
          *(undefined1 *)(lVar2 + 0x80) = *(undefined1 *)(lVar2 + 0x8c);
          wVar4 = zip_alloc_decryption_buffer(a);
          return wVar4;
        }
        goto LAB_0035b748;
      }
      if (iVar8 == -0x2711) {
        pcVar5 = "Too many incorrect passphrases";
        goto LAB_0035b6d6;
      }
      iVar8 = iVar8 + -1;
    } while( true );
  }
  pcVar5 = "Truncated ZIP file data";
LAB_0035b74f:
  archive_set_error(&a->archive,0x54,pcVar5);
  return L'\xffffffe2';
}

Assistant:

static int
init_WinZip_AES_decryption(struct archive_read *a)
{
	struct zip *zip = (struct zip *)(a->format->data);
	const void *p;
	const uint8_t *pv;
	size_t key_len, salt_len;
	uint8_t derived_key[MAX_DERIVED_KEY_BUF_SIZE];
	int retry;
	int r;

	if (zip->cctx_valid || zip->hctx_valid)
		return (ARCHIVE_OK);

	switch (zip->entry->aes_extra.strength) {
	case 1: salt_len = 8;  key_len = 16; break;
	case 2: salt_len = 12; key_len = 24; break;
	case 3: salt_len = 16; key_len = 32; break;
	default: goto corrupted;
	}
	p = __archive_read_ahead(a, salt_len + 2, NULL);
	if (p == NULL)
		goto truncated;

	for (retry = 0;; retry++) {
		const char *passphrase;

		passphrase = __archive_read_next_passphrase(a);
		if (passphrase == NULL) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    (retry > 0)?
				"Incorrect passphrase":
				"Passphrase required for this entry");
			return (ARCHIVE_FAILED);
		}
		memset(derived_key, 0, sizeof(derived_key));
		r = archive_pbkdf2_sha1(passphrase, strlen(passphrase),
		    p, salt_len, 1000, derived_key, key_len * 2 + 2);
		if (r != 0) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Decryption is unsupported due to lack of "
			    "crypto library");
			return (ARCHIVE_FAILED);
		}

		/* Check password verification value. */
		pv = ((const uint8_t *)p) + salt_len;
		if (derived_key[key_len * 2] == pv[0] &&
		    derived_key[key_len * 2 + 1] == pv[1])
			break;/* The passphrase is OK. */
		if (retry > 10000) {
			/* Avoid infinity loop. */
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Too many incorrect passphrases");
			return (ARCHIVE_FAILED);
		}
	}

	r = archive_decrypto_aes_ctr_init(&zip->cctx, derived_key, key_len);
	if (r != 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Decryption is unsupported due to lack of crypto library");
		return (ARCHIVE_FAILED);
	}
	r = archive_hmac_sha1_init(&zip->hctx, derived_key + key_len, key_len);
	if (r != 0) {
		archive_decrypto_aes_ctr_release(&zip->cctx);
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Failed to initialize HMAC-SHA1");
		return (ARCHIVE_FAILED);
	}
	zip->cctx_valid = zip->hctx_valid = 1;
	__archive_read_consume(a, salt_len + 2);
	zip->entry_bytes_remaining -= salt_len + 2 + AUTH_CODE_SIZE;
	if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END)
	    && zip->entry_bytes_remaining < 0)
		goto corrupted;
	zip->entry_compressed_bytes_read += salt_len + 2 + AUTH_CODE_SIZE;
	zip->decrypted_bytes_remaining = 0;

	zip->entry->compression = zip->entry->aes_extra.compression;
	return (zip_alloc_decryption_buffer(a));

truncated:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Truncated ZIP file data");
	return (ARCHIVE_FATAL);
corrupted:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Corrupted ZIP file data");
	return (ARCHIVE_FATAL);
}